

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O1

void printwbmp(Wbmp *wbmp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (0 < wbmp->height) {
    iVar2 = 0;
    do {
      iVar1 = wbmp->width;
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          putchar((uint)(wbmp->bitmap[iVar1 * iVar2 + lVar3] == 0) * 3 + 0x20);
          iVar1 = wbmp->width;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < iVar1);
      }
      putchar(10);
      iVar2 = iVar2 + 1;
    } while (iVar2 < wbmp->height);
  }
  return;
}

Assistant:

void printwbmp(Wbmp *wbmp)
{
	int row, col;

	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[wbmp->width * row + col] == WBMP_BLACK) {
				putchar('#');
			} else {
				putchar(' ');
			}
		}
		putchar('\n');
	}
}